

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

bool __thiscall Minisat::DoubleOption::parse(DoubleOption *this,char *str)

{
  double dVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *__format;
  double dVar5;
  char *span;
  char *end;
  
  span = str;
  bVar3 = match<char_const*>(&span,"-");
  if (((!bVar3) || (bVar3 = match<char_const*>(&span,(this->super_Option).name), !bVar3)) ||
     (bVar3 = match<char_const*>(&span,"="), pcVar2 = span, !bVar3)) {
    return false;
  }
  dVar5 = strtod(span,&end);
  bVar3 = end != (char *)0x0;
  if (!bVar3) {
    return bVar3;
  }
  dVar1 = (this->range).end;
  if (dVar5 < dVar1) {
LAB_0010ecc7:
    dVar1 = (this->range).begin;
    if (dVar1 < dVar5) {
LAB_0010ece0:
      this->value = dVar5;
      return bVar3;
    }
    if ((this->range).begin_inclusive == true) {
      if ((dVar5 == dVar1) && (!NAN(dVar5) && !NAN(dVar1))) goto LAB_0010ece0;
    }
    pcVar4 = (this->super_Option).name;
    __format = "ERROR! value <%s> is too small for option \"%s\".\n";
  }
  else {
    if ((this->range).end_inclusive == true) {
      if ((dVar5 == dVar1) && (!NAN(dVar5) && !NAN(dVar1))) goto LAB_0010ecc7;
    }
    pcVar4 = (this->super_Option).name;
    __format = "ERROR! value <%s> is too large for option \"%s\".\n";
  }
  fprintf(_stderr,__format,pcVar2,pcVar4);
  exit(1);
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 

        if (!match(span, "-") || !match(span, name) || !match(span, "="))
            return false;

        char*  end;
        double tmp = strtod(span, &end);

        if (end == NULL) 
            return false;
        else if (tmp >= range.end && (!range.end_inclusive || tmp != range.end)){
            fprintf(stderr, "ERROR! value <%s> is too large for option \"%s\".\n", span, name);
            exit(1);
        }else if (tmp <= range.begin && (!range.begin_inclusive || tmp != range.begin)){
            fprintf(stderr, "ERROR! value <%s> is too small for option \"%s\".\n", span, name);
            exit(1); }

        value = tmp;
        // fprintf(stderr, "READ VALUE: %g\n", value);

        return true;
    }